

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTAircraft.cpp
# Opt level: O3

void __thiscall LTAircraft::UpdatePosition(LTAircraft *this,float param_1,int cycle)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  flightPhaseE fVar2;
  pointer pfVar3;
  double dVar4;
  _Alloc_hider _Var5;
  bool bVar6;
  string *psVar7;
  string *psVar8;
  ulong uVar9;
  float fVar10;
  double dVar11;
  FDDynamicData dynCopy;
  allocator<char> local_241;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  undefined1 local_1c0 [96];
  _Alloc_hider local_160;
  size_type local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  _Alloc_hider local_140;
  size_type local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  _Alloc_hider local_120;
  size_type local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  undefined8 local_100;
  int local_f8;
  bool local_f4;
  Doc8643 *local_f0;
  _Alloc_hider local_e8;
  size_type local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  string *local_c8;
  string *psStack_c0;
  pointer local_b8;
  _Alloc_hider local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  _Alloc_hider local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  undefined2 local_30;
  
  if (currCycle.num != cycle) {
    NextCycle(cycle);
  }
  if ((((this->super_Aircraft).bValid == true) && (dataRefs.bReInitAll == false)) &&
     (bVar6 = CalcPPos(this), bVar6)) {
    if (this->bChangeModel == true) {
      ChangeModel(this);
    }
    XPMP2::Aircraft::SetLocation
              (&this->super_Aircraft,(this->ppos)._lat,(this->ppos)._lon,(this->ppos)._alt / 0.3048)
    ;
    dVar4 = (this->ppos)._pitch;
    dVar11 = (this->ppos)._roll;
    (this->super_Aircraft).drawInfo.roll = (float)(double)(-(ulong)!NAN(dVar11) & (ulong)dVar11);
    dVar11 = (this->ppos)._head + (this->corrAngle).val;
    (this->super_Aircraft).drawInfo.pitch = (float)(double)(-(ulong)!NAN(dVar4) & (ulong)dVar4);
    (this->super_Aircraft).drawInfo.heading = (float)(double)(-(ulong)!NAN(dVar11) & (ulong)dVar11);
    dVar11 = MovingParam::get(&this->gear);
    *(this->super_Aircraft).v.super__Vector_base<float,_std::allocator<float>_>._M_impl.
     super__Vector_impl_data._M_start = (float)dVar11;
    dVar11 = MovingParam::get(&this->flaps);
    pfVar3 = (this->super_Aircraft).v.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    pfVar3[2] = (float)dVar11;
    pfVar3[5] = (float)dVar11;
    dVar11 = MovingParam::get(&this->spoilers);
    pfVar3 = (this->super_Aircraft).v.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    pfVar3[3] = (float)dVar11;
    pfVar3[4] = (float)dVar11;
    dVar11 = MovingParam::get(&this->reversers);
    (this->super_Aircraft).v.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_start[0x1c] = (float)dVar11;
    dVar11 = MovingParam::get(&this->reversers);
    pfVar3 = (this->super_Aircraft).v.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    pfVar3[0xb] = (float)dVar11;
    if (((this->pDoc8643->classification)._M_string_length == 0) ||
       (1 < (byte)(*(this->pDoc8643->classification)._M_dataplus._M_p + 0xb9U))) {
      dVar11 = this->pMdl->PROP_RPM_MAX;
      dVar11 = (double)pfVar3[7] * dVar11 * 0.5 + dVar11 * 0.5;
    }
    else {
      dVar11 = this->pMdl->PROP_RPM_MAX;
    }
    XPMP2::Aircraft::SetEngineRotRpm(&this->super_Aircraft,(float)dVar11);
    pfVar3 = (this->super_Aircraft).v.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    fVar10 = pfVar3[0x17];
    pfVar3[0x1a] = fVar10;
    pfVar3[0x1b] = fVar10 * 0.10471976;
    XPMP2::Aircraft::SetEngineRotAngle
              (&this->super_Aircraft,
               (float)currCycle.diffTime * (fVar10 / 60.0) * 360.0 + pfVar3[0x16]);
    while( true ) {
      pfVar3 = (this->super_Aircraft).v.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      fVar10 = pfVar3[0x16];
      if (fVar10 < 360.0) break;
      XPMP2::Aircraft::SetEngineRotAngle(&this->super_Aircraft,fVar10 + -360.0);
    }
    pfVar3[0x19] = fVar10;
    dVar11 = MovingParam::get(&this->gearDeflection);
    (this->super_Aircraft).v.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_start[0x12] = (float)dVar11;
    dVar11 = MovingParam::get(&this->tireRpm);
    fVar10 = (float)dVar11;
    pfVar3 = (this->super_Aircraft).v.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    pfVar3[0x14] = fVar10;
    pfVar3[0x15] = fVar10 * 0.10471976;
    for (fVar10 = (float)currCycle.diffTime * (fVar10 / 60.0) * 360.0 + pfVar3[0x13];
        360.0 <= fVar10; fVar10 = fVar10 + -360.0) {
    }
    pfVar3[0x13] = fVar10;
    fVar10 = 0.0;
    if ((this->reversers).bIncrease == true) {
      fVar10 = (float)((this->reversers).timeFrom <= currCycle.simTime &&
                      currCycle.simTime <= (this->reversers).timeTo);
    }
    pfVar3[0x29] = fVar10;
    if (currCycle.num % 100 < 2) {
      LTFlightData::FDDynamicData::FDDynamicData((FDDynamicData *)local_1c0);
      bVar6 = LTFlightData::TryGetSafeCopy(this->fd,(FDDynamicData *)local_1c0);
      if (bVar6) {
        (this->super_Aircraft).acRadar.mode = local_1c0._16_4_;
        (this->super_Aircraft).acRadar.size = local_1c0._0_8_;
        (this->super_Aircraft).acRadar.code = local_1c0._8_8_;
      }
    }
    fVar2 = this->phase;
    if ((fVar2 == FPH_PARKED) ||
       ((dataRefs.bAINotOnGnd != 0 && (bVar6 = IsOnRwy(this), fVar2 == FPH_TAXI && !bVar6)))) {
      (this->super_Aircraft).acRadar.mode = xpmpTransponderMode_Standby;
    }
    if (this->bSendNewInfoData == true) {
      local_1c0._0_8_ = local_1c0 + 0x10;
      local_1c0._8_8_ = 0;
      local_1c0._16_4_ = local_1c0._16_4_ & 0xffffff00;
      local_1c0._32_8_ = local_1c0 + 0x30;
      local_1c0._40_8_ = 0.0;
      local_1c0[0x30] = '\0';
      local_1c0._64_8_ = local_1c0 + 0x50;
      local_1c0._72_8_ = 0;
      local_1c0[0x50] = '\0';
      local_160._M_p = (pointer)&local_150;
      local_158 = 0;
      local_150._M_local_buf[0] = '\0';
      local_140._M_p = (pointer)&local_130;
      local_138 = 0;
      local_130._M_local_buf[0] = '\0';
      local_120._M_p = (pointer)&local_110;
      local_118 = 0;
      local_110._M_local_buf[0] = '\0';
      local_100._0_4_ = -1;
      local_100._4_4_ = -1;
      local_f8 = 0;
      local_f4 = false;
      local_f0 = (Doc8643 *)0x0;
      local_e8._M_p = (pointer)&local_d8;
      local_e0 = 0;
      local_d8._M_local_buf[0] = '\0';
      local_b8 = (pointer)0x0;
      local_c8 = (string *)0x0;
      psStack_c0 = (string *)0x0;
      local_b0._M_p = (pointer)&local_a0;
      local_a8 = 0;
      local_a0._M_local_buf[0] = '\0';
      local_90._M_p = (pointer)&local_80;
      local_88 = 0;
      local_80._M_local_buf[0] = '\0';
      local_70._M_p = (pointer)&local_60;
      local_68 = 0;
      local_60._M_local_buf[0] = '\0';
      local_50._M_p = (pointer)&local_40;
      local_48 = 0;
      local_40._M_local_buf[0] = '\0';
      local_30._0_1_ = false;
      local_30._1_1_ = false;
      bVar6 = LTFlightData::TryGetSafeCopy(this->fd,(FDStaticData *)local_1c0);
      if (bVar6) {
        strncpy((this->super_Aircraft).acInfoTexts.tailNum,(char *)local_1c0._0_8_,9);
        (this->super_Aircraft).acInfoTexts.tailNum[9] = '\0';
        strncpy((this->super_Aircraft).acInfoTexts.icaoAcType,(char *)local_1c0._64_8_,4);
        (this->super_Aircraft).acInfoTexts.icaoAcType[4] = '\0';
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1e0,local_160._M_p,&local_241);
        strAtMost(&local_240,&local_1e0,0x27);
        _Var5._M_p = local_240._M_dataplus._M_p;
        paVar1 = &local_240.field_2;
        strncpy((this->super_Aircraft).acInfoTexts.manufacturer,local_240._M_dataplus._M_p,0x27);
        (this->super_Aircraft).acInfoTexts.manufacturer[0x27] = '\0';
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var5._M_p != paVar1) {
          operator_delete(_Var5._M_p,local_240.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_200,local_140._M_p,&local_241);
        strAtMost(&local_240,&local_200,0x27);
        _Var5._M_p = local_240._M_dataplus._M_p;
        strncpy((this->super_Aircraft).acInfoTexts.model,local_240._M_dataplus._M_p,0x27);
        (this->super_Aircraft).acInfoTexts.model[0x27] = '\0';
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var5._M_p != paVar1) {
          operator_delete(_Var5._M_p,local_240.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
        }
        strncpy((this->super_Aircraft).acInfoTexts.icaoAirline,local_50._M_p,3);
        (this->super_Aircraft).acInfoTexts.icaoAirline[3] = '\0';
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_220,local_70._M_p,&local_241);
        strAtMost(&local_240,&local_220,0x27);
        strncpy((this->super_Aircraft).acInfoTexts.airline,local_240._M_dataplus._M_p,0x27);
        (this->super_Aircraft).acInfoTexts.airline[0x27] = '\0';
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_dataplus._M_p != paVar1) {
          operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        }
        strncpy((this->super_Aircraft).acInfoTexts.flightNum,local_b0._M_p,9);
        psVar8 = psStack_c0;
        (this->super_Aircraft).acInfoTexts.flightNum[9] = '\0';
        uVar9 = (long)psStack_c0 - (long)local_c8;
        psVar7 = local_c8;
        if (psStack_c0 == local_c8) {
          psVar7 = &LTFlightData::FDStaticData::emptyStr_abi_cxx11_;
        }
        strncpy((this->super_Aircraft).acInfoTexts.aptFrom,(psVar7->_M_dataplus)._M_p,4);
        (this->super_Aircraft).acInfoTexts.aptFrom[4] = '\0';
        psVar8 = psVar8 + -1;
        if (uVar9 < 0x21) {
          psVar8 = &LTFlightData::FDStaticData::emptyStr_abi_cxx11_;
        }
        strncpy((this->super_Aircraft).acInfoTexts.aptTo,(psVar8->_M_dataplus)._M_p,4);
        (this->super_Aircraft).acInfoTexts.aptTo[4] = '\0';
      }
      LTFlightData::FDStaticData::~FDStaticData((FDStaticData *)local_1c0);
    }
  }
  return;
}

Assistant:

void LTAircraft::UpdatePosition (float, int cycle)
{
    try {
        // We (LT) don't get called anywhere else once per frame.
        // XPMP API calls directly for aircraft positions.
        // So we need to figure out our way if we are called the first time of a cycle
        if ( cycle != currCycle.num )            // new cycle!
            NextCycle(cycle);
        
        // object invalid (due to exceptions most likely), don't use anymore, don't call LT functions
        if (!IsValid() ||
            dataRefs.IsReInitAll())
            return;

#ifdef DEBUG
        gSelAcCalc = fd.bIsSelected = bIsSelected = (key() == dataRefs.GetSelectedAcKey());
#endif
        
        
        // *** Position ***
        if (!CalcPPos())
            return;
        
        // If needed update the chosen CSL model
        if (ShallUpdateModel())
            ChangeModel();
        
        // Set Position
        SetLocation(ppos.lat(), ppos.lon(), ppos.alt_ft());
        drawInfo.pitch   = float(nanToZero(GetPitch()));
        drawInfo.roll    = float(nanToZero(GetRoll()));
        drawInfo.heading = float(nanToZero(GetHeading()));
        
        // *** Configuration ***
        
        SetGearRatio((float)gear.get());                // gear
        SetFlapRatio((float)flaps.get());               // flaps, and slats the same
        SetSlatRatio(GetFlapRatio());
        SetSpoilerRatio((float)spoilers.get());         // spoilers, and speed brakes the same
        SetSpeedbrakeRatio(GetSpoilerRatio());
        SetReversDeployRatio((float)reversers.get());   // opening reversers
        SetThrustReversRatio((float)reversers.get());

        // for engine / prop rotation we derive a value based on flight model
        if (pDoc8643->hasRotor())
            SetEngineRotRpm(float(pMdl->PROP_RPM_MAX));
        else
            SetEngineRotRpm(float(pMdl->PROP_RPM_MAX/2 + GetThrustRatio() * pMdl->PROP_RPM_MAX/2));
        SetPropRotRpm(GetEngineRotRpm());
        
        // Make props and rotors move based on rotation speed and time passed since last cycle
        SetEngineRotAngle(GetEngineRotAngle() + RpmToDegree(GetEngineRotRpm(), currCycle.diffTime));

        while (GetEngineRotAngle() >= 360.0f)
            SetEngineRotAngle(GetEngineRotAngle() - 360.0f);
        SetPropRotAngle(GetEngineRotAngle());
        
        // Gear deflection - has an effect during touch-down only
        SetTireDeflection((float)gearDeflection.get());
        
        // Tire rotation similarly
        SetTireRotRpm((float)tireRpm.get());
        SetTireRotAngle(GetTireRotAngle() + RpmToDegree(GetTireRotRpm(), currCycle.diffTime));
        while (GetTireRotAngle() >= 360.0f)
            SetTireRotAngle(GetTireRotAngle() - 360.0f);

        // 'moment' of touch down?
        // (We use the reversers deploy time for this...that's 2s)
        SetTouchDown(reversers.isIncrease() && reversers.inMotion());
        
        // *** Radar ***
        
        // for radar 'calculation' we need some dynData
        // but radar doesn't change often...just only check every 100th cycle
        if ( currCycle.num % 100 <= 1 )
        {
            // fetch new data if available
            LTFlightData::FDDynamicData dynCopy;
            if ( fd.TryGetSafeCopy(dynCopy) )
            {
                // copy fresh radar data
                acRadar               = dynCopy.radar;
            }
        }
        
        // -> deactivate TCAS in some cases like parked or taxiing outside runway
        // (will be re-activated by the above code every 100th cycle)
        if (phase == FPH_PARKED ||
            (dataRefs.IsAINotOnGnd() && !IsOnRwy() && phase == FPH_TAXI))
            acRadar.mode = xpmpTransponderMode_Standby;

        // *** Informational Texts ***

        // Is there new data to send?
        if (ShallSendNewInfoData())
        {
            // fetch new data if available
            LTFlightData::FDStaticData statCopy;
            if (fd.TryGetSafeCopy(statCopy))
            {
                // copy data over to libxplanemp
                STRCPY_S     (acInfoTexts.tailNum,      statCopy.reg.c_str());
                STRCPY_S     (acInfoTexts.icaoAcType,   statCopy.acTypeIcao.c_str());
                STRCPY_ATMOST(acInfoTexts.manufacturer, statCopy.man.c_str());
                STRCPY_ATMOST(acInfoTexts.model,        statCopy.mdl.c_str());
                STRCPY_S     (acInfoTexts.icaoAirline,  statCopy.opIcao.c_str());
                STRCPY_ATMOST(acInfoTexts.airline,      statCopy.op.c_str());
                STRCPY_S     (acInfoTexts.flightNum,    statCopy.flight.c_str());
                STRCPY_S     (acInfoTexts.aptFrom,      statCopy.origin().c_str());
                STRCPY_S     (acInfoTexts.aptTo,        statCopy.dest().c_str());
            }
        }
        
        // Done, ie. in success case we return here
        return;
        
    } catch (const std::exception& e) {
        LOG_MSG(logERR, ERR_TOP_LEVEL_EXCEPTION, e.what());
    } catch (...) {}

    // for any kind of exception: don't use this object any more!
    SetInvalid();
}